

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int readDbPage(PgHdr *pPg,u32 iFrame)

{
  u16 uVar1;
  uint uVar2;
  Pgno PVar3;
  Pager *pPVar4;
  sqlite3_io_methods *psVar5;
  sqlite3_file *psVar6;
  uint uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  pPVar4 = pPg->pPager;
  uVar2 = pPVar4->pageSize;
  psVar5 = pPVar4->fd->pMethods;
  if (psVar5 == (sqlite3_io_methods *)0x0) {
    iVar9 = 0;
    memset(pPg->pData,0,(long)(int)uVar2);
  }
  else {
    PVar3 = pPg->pgno;
    if (iFrame == 0) {
      iVar10 = (*psVar5->xRead)(pPVar4->fd,pPg->pData,uVar2,(ulong)(PVar3 - 1) * (long)(int)uVar2);
      iVar9 = 0;
      if (iVar10 != 0x20a) {
        iVar9 = iVar10;
      }
    }
    else {
      psVar6 = pPVar4->pWal->pWalFd;
      uVar1 = (pPVar4->pWal->hdr).szPage;
      uVar11 = CONCAT22(uVar1,uVar1) & 0x1fe00;
      uVar7 = uVar11;
      if ((int)uVar2 <= (int)uVar11) {
        uVar7 = uVar2;
      }
      iVar9 = (*psVar6->pMethods->xRead)
                        (psVar6,pPg->pData,uVar7,(ulong)(uVar11 + 0x18) * (ulong)(iFrame - 1) + 0x38
                        );
    }
    if (PVar3 == 1) {
      if (iVar9 == 0) {
        uVar8 = *(undefined8 *)((long)pPg->pData + 0x20);
        *(undefined8 *)pPVar4->dbFileVers = *(undefined8 *)((long)pPg->pData + 0x18);
        *(undefined8 *)(pPVar4->dbFileVers + 8) = uVar8;
        iVar9 = 0;
      }
      else {
        pPVar4->dbFileVers[0] = -1;
        pPVar4->dbFileVers[1] = -1;
        pPVar4->dbFileVers[2] = -1;
        pPVar4->dbFileVers[3] = -1;
        pPVar4->dbFileVers[4] = -1;
        pPVar4->dbFileVers[5] = -1;
        pPVar4->dbFileVers[6] = -1;
        pPVar4->dbFileVers[7] = -1;
        pPVar4->dbFileVers[8] = -1;
        pPVar4->dbFileVers[9] = -1;
        pPVar4->dbFileVers[10] = -1;
        pPVar4->dbFileVers[0xb] = -1;
        pPVar4->dbFileVers[0xc] = -1;
        pPVar4->dbFileVers[0xd] = -1;
        pPVar4->dbFileVers[0xe] = -1;
        pPVar4->dbFileVers[0xf] = -1;
      }
    }
  }
  return iVar9;
}

Assistant:

static int readDbPage(PgHdr *pPg, u32 iFrame){
  Pager *pPager = pPg->pPager; /* Pager object associated with page pPg */
  Pgno pgno = pPg->pgno;       /* Page number to read */
  int rc = SQLITE_OK;          /* Return code */
  int pgsz = pPager->pageSize; /* Number of bytes to read */

  assert( pPager->eState>=PAGER_READER && !MEMDB );
  assert( isOpen(pPager->fd) );

  if( NEVER(!isOpen(pPager->fd)) ){
    assert( pPager->tempFile );
    memset(pPg->pData, 0, pPager->pageSize);
    return SQLITE_OK;
  }

#ifndef SQLITE_OMIT_WAL
  if( iFrame ){
    /* Try to pull the page from the write-ahead log. */
    rc = sqlite3WalReadFrame(pPager->pWal, iFrame, pgsz, pPg->pData);
  }else
#endif
  {
    i64 iOffset = (pgno-1)*(i64)pPager->pageSize;
    rc = sqlite3OsRead(pPager->fd, pPg->pData, pgsz, iOffset);
    if( rc==SQLITE_IOERR_SHORT_READ ){
      rc = SQLITE_OK;
    }
  }

  if( pgno==1 ){
    if( rc ){
      /* If the read is unsuccessful, set the dbFileVers[] to something
      ** that will never be a valid file version.  dbFileVers[] is a copy
      ** of bytes 24..39 of the database.  Bytes 28..31 should always be
      ** zero or the size of the database in page. Bytes 32..35 and 35..39
      ** should be page numbers which are never 0xffffffff.  So filling
      ** pPager->dbFileVers[] with all 0xff bytes should suffice.
      **
      ** For an encrypted database, the situation is more complex:  bytes
      ** 24..39 of the database are white noise.  But the probability of
      ** white noising equaling 16 bytes of 0xff is vanishingly small so
      ** we should still be ok.
      */
      memset(pPager->dbFileVers, 0xff, sizeof(pPager->dbFileVers));
    }else{
      u8 *dbFileVers = &((u8*)pPg->pData)[24];
      memcpy(&pPager->dbFileVers, dbFileVers, sizeof(pPager->dbFileVers));
    }
  }
  CODEC1(pPager, pPg->pData, pgno, 3, rc = SQLITE_NOMEM);

  PAGER_INCR(sqlite3_pager_readdb_count);
  PAGER_INCR(pPager->nRead);
  IOTRACE(("PGIN %p %d\n", pPager, pgno));
  PAGERTRACE(("FETCH %d page %d hash(%08x)\n",
               PAGERID(pPager), pgno, pager_pagehash(pPg)));

  return rc;
}